

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O3

opus_int64 op_raw_total(OggOpusFile *_of,int _li)

{
  opus_int64 oVar1;
  OggOpusLink *pOVar2;
  long lVar3;
  
  oVar1 = -0x83;
  if (((1 < _of->ready_state) && (_of->seekable != 0)) && (_li < _of->nlinks)) {
    if (-1 < _li) {
      if ((int)(_li + 1U) < _of->nlinks) {
        pOVar2 = _of->links + (_li + 1U);
      }
      else {
        pOVar2 = (OggOpusLink *)&_of->end;
      }
      if (_li == 0) {
        lVar3 = 0;
      }
      else {
        lVar3 = _of->links[(uint)_li].offset;
      }
      return pOVar2->offset - lVar3;
    }
    oVar1 = _of->end;
  }
  return oVar1;
}

Assistant:

opus_int64 op_raw_total(const OggOpusFile *_of,int _li){
  if(OP_UNLIKELY(_of->ready_state<OP_OPENED)
   ||OP_UNLIKELY(!_of->seekable)
   ||OP_UNLIKELY(_li>=_of->nlinks)){
    return OP_EINVAL;
  }
  if(_li<0)return _of->end;
  return (_li+1>=_of->nlinks?_of->end:_of->links[_li+1].offset)
   -(_li>0?_of->links[_li].offset:0);
}